

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O0

void __thiscall UnixMakefileGenerator::init2(UnixMakefileGenerator *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  ulong uVar5;
  long in_RDI;
  long in_FS_OFFSET;
  ProStringList *ar_cmd;
  ProString MD_flag;
  QString sonameprefix;
  QString instpath;
  ProString soname;
  QString prefix;
  QString target;
  ProString bundle_loc_1;
  ProString bundle_loc;
  undefined7 in_stack_ffffffffffff6ab8;
  undefined1 in_stack_ffffffffffff6abf;
  QMakeProject *in_stack_ffffffffffff6ac0;
  QMakeProject *this_00;
  QMakeProject *in_stack_ffffffffffff6ac8;
  undefined6 in_stack_ffffffffffff6ad0;
  undefined1 in_stack_ffffffffffff6ad6;
  undefined1 in_stack_ffffffffffff6ad7;
  QMakeProject *in_stack_ffffffffffff6ad8;
  undefined7 in_stack_ffffffffffff6ae0;
  undefined1 in_stack_ffffffffffff6ae7;
  byte bVar6;
  char *in_stack_ffffffffffff6ae8;
  ProStringList *in_stack_ffffffffffff6af8;
  byte local_9389;
  bool local_9311;
  byte local_9299;
  undefined1 local_8ad8 [4462];
  QChar local_796a [49];
  undefined8 local_7908;
  undefined8 local_7900;
  undefined8 local_78f8;
  undefined8 local_7818;
  undefined8 local_7810;
  undefined8 local_7808;
  ProString local_7400 [499];
  undefined8 local_1648;
  undefined8 local_1640;
  undefined8 local_1638;
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_10a0;
  ProString local_1038 [20];
  QLatin1String *local_c68;
  CaseSensitivity local_c60;
  undefined1 local_c58 [2312];
  ProString local_350 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                 (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
  bVar2 = QMakeProject::isEmpty
                    (in_stack_ffffffffffff6ad8,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
  ProKey::~ProKey((ProKey *)0x21d7f0);
  if (bVar2) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffff6ad7,
                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffff6ac0,
               (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProString::~ProString((ProString *)0x21d8b5);
    ProKey::~ProKey((ProKey *)0x21d8c2);
    ProKey::~ProKey((ProKey *)0x21d8cf);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                 (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
  QMakeEvaluator::first
            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
             (ProKey *)
             CONCAT17(in_stack_ffffffffffff6ad7,
                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
  bVar2 = ProString::operator==
                    ((ProString *)CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                     (char *)in_stack_ffffffffffff6ad8);
  ProString::~ProString((ProString *)0x21d93f);
  ProKey::~ProKey((ProKey *)0x21d94c);
  if (bVar2) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffff6ad7,
                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffff6ad7,
                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
    ::operator+((ProString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
    ProString::ProString<ProString,ProString>
              ((ProString *)
               CONCAT17(in_stack_ffffffffffff6ad7,
                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
               (QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac8);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_ffffffffffff6ac0,
               (ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProStringList::operator=
              ((ProStringList *)in_stack_ffffffffffff6ac0,
               (ProStringList *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::~ProKey((ProKey *)0x21da90);
    ProStringList::~ProStringList((ProStringList *)0x21da9d);
    ProString::~ProString((ProString *)0x21daaa);
    QStringBuilder<ProString,_ProString>::~QStringBuilder
              ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac0);
    ProString::~ProString((ProString *)0x21dac4);
    ProKey::~ProKey((ProKey *)0x21dad1);
    ProString::~ProString((ProString *)0x21dade);
    ProKey::~ProKey((ProKey *)0x21daeb);
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x21db38);
    ProKey::~ProKey((ProKey *)0x21db4e);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
      bVar2 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                         (bool)in_stack_ffffffffffff6abf);
      QString::~QString((QString *)0x21df8d);
      if (bVar2) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffff6ac0);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProString::prepend((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                           (ProString *)in_stack_ffffffffffff6ad8);
        ProStringList::ProStringList
                  ((ProStringList *)in_stack_ffffffffffff6ac0,
                   (ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProStringList::operator=
                  ((ProStringList *)in_stack_ffffffffffff6ac0,
                   (ProStringList *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::~ProKey((ProKey *)0x21e0ba);
        ProStringList::~ProStringList((ProStringList *)0x21e0c7);
        ProString::~ProString((ProString *)0x21e0d4);
        ProKey::~ProKey((ProKey *)0x21e0e1);
        ProKey::~ProKey((ProKey *)0x21e0ee);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ::operator+((char (*) [2])in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffff6ac0);
        ProString::operator+=
                  ((ProString *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                   (QStringBuilder<const_char_(&)[2],_ProString> *)in_stack_ffffffffffff6ac8);
        ProKey::~ProKey((ProKey *)0x21e1b7);
        QStringBuilder<const_char_(&)[2],_ProString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[2],_ProString> *)0x21e1c4);
        ProString::~ProString((ProString *)0x21e1d1);
        ProKey::~ProKey((ProKey *)0x21e1de);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x21e226);
        ProKey::~ProKey((ProKey *)0x21e23a);
        if (bVar2) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffff6ac0,(char *)in_stack_ffffffffffff6ad8);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::~ProString((ProString *)0x21e2c8);
          ProKey::~ProKey((ProKey *)0x21e2d5);
        }
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ::operator+((ProString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ::operator+((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac8,
                    (ProString *)in_stack_ffffffffffff6ac0);
        ::operator+((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)
                    in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>
                     *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
        ProString::
        ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char_const(&)[2]>,ProString>
                  ((ProString *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                    *)in_stack_ffffffffffff6ac8);
        QList<ProString>::append
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProString::~ProString((ProString *)0x21e4ef);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)in_stack_ffffffffffff6ac0);
        ProString::~ProString((ProString *)0x21e509);
        ProKey::~ProKey((ProKey *)0x21e516);
        QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_const_char_(&)[2]>
                           *)0x21e523);
        QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)
                   in_stack_ffffffffffff6ac0);
        ProString::~ProString((ProString *)0x21e53d);
        ProKey::~ProKey((ProKey *)0x21e54a);
        QStringBuilder<ProString,_ProString>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac0);
        ProString::~ProString((ProString *)0x21e564);
        ProKey::~ProKey((ProKey *)0x21e571);
        ProString::~ProString((ProString *)0x21e57e);
        ProKey::~ProKey((ProKey *)0x21e58b);
        ProKey::~ProKey((ProKey *)0x21e598);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::~ProKey((ProKey *)0x21e5ff);
        bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x21e61c);
        if (bVar2) {
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffff6ac0,(char *)in_stack_ffffffffffff6ad8);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::~ProString((ProString *)0x21e733);
        }
        else {
          QList<ProString>::at
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::toQString
                    ((ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                     (char *)in_stack_ffffffffffff6ac8);
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                     (char *)in_stack_ffffffffffff6ac8);
          QString::replace((QLatin1String *)local_c58,local_c68,local_c60);
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffff6ac0,
                     (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QList<ProString>::operator[]
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::operator=
                    ((ProString *)in_stack_ffffffffffff6ac0,
                     (ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::~ProString((ProString *)0x21e6de);
          QString::~QString((QString *)0x21e6eb);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        bVar2 = QMakeProject::isEmpty
                          (in_stack_ffffffffffff6ad8,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProKey::~ProKey((ProKey *)0x21e789);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
          bVar2 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                             (bool)in_stack_ffffffffffff6abf);
          QString::~QString((QString *)0x21f0a5);
          if (bVar2) {
            local_1648 = 0xaaaaaaaaaaaaaaaa;
            local_1640 = 0xaaaaaaaaaaaaaaaa;
            local_1638 = 0xaaaaaaaaaaaaaaaa;
            QString::QString((QString *)0x21f0ef);
            QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8)
            ;
            bVar2 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                               (bool)in_stack_ffffffffffff6abf);
            QString::~QString((QString *)0x21f147);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              QString::operator=((QString *)in_stack_ffffffffffff6ac8,in_stack_ffffffffffff6ae8);
            }
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((QString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0)
            ;
            ProString::ProString<QString&,ProString>
                      ((ProString *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                       (QStringBuilder<QString_&,_ProString> *)in_stack_ffffffffffff6ac8);
            QList<ProString>::prepend
                      ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                       (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::~ProString((ProString *)0x21f24f);
            QStringBuilder<QString_&,_ProString>::~QStringBuilder
                      ((QStringBuilder<QString_&,_ProString> *)0x21f25c);
            ProString::~ProString((ProString *)0x21f269);
            ProKey::~ProKey((ProKey *)0x21f276);
            ProKey::~ProKey((ProKey *)0x21f283);
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((QString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0)
            ;
            ::operator+((QStringBuilder<QString_&,_ProString> *)in_stack_ffffffffffff6ac8,
                        (char (*) [2])in_stack_ffffffffffff6ac0);
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)
                        in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>
                      ((ProString *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                       (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)in_stack_ffffffffffff6ac8);
            QList<ProString>::append
                      ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                       (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::~ProString((ProString *)0x21f3eb);
            QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac0);
            ProString::~ProString((ProString *)0x21f405);
            ProKey::~ProKey((ProKey *)0x21f412);
            QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *)
                       0x21f41f);
            QStringBuilder<QString_&,_ProString>::~QStringBuilder
                      ((QStringBuilder<QString_&,_ProString> *)0x21f42c);
            ProString::~ProString((ProString *)0x21f439);
            ProKey::~ProKey((ProKey *)0x21f446);
            ProKey::~ProKey((ProKey *)0x21f453);
            QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8)
            ;
            bVar2 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                               (bool)in_stack_ffffffffffff6abf);
            QString::~QString((QString *)0x21f4a9);
            if (bVar2) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((QString *)in_stack_ffffffffffff6ac8,
                          (ProString *)in_stack_ffffffffffff6ac0);
              ::operator+((QStringBuilder<QString_&,_ProString> *)in_stack_ffffffffffff6ac8,
                          (char (*) [2])in_stack_ffffffffffff6ac0);
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *
                          )in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
              ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
              ProString::
              ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)in_stack_ffffffffffff6ac8);
              QList<ProString>::append
                        ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                         (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProString::~ProString((ProString *)0x21f6a2);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)in_stack_ffffffffffff6ac0);
              ProString::~ProString((ProString *)0x21f6bc);
              ProKey::~ProKey((ProKey *)0x21f6c9);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                 *)0x21f6d6);
              QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)in_stack_ffffffffffff6ac0);
              ProString::~ProString((ProString *)0x21f6f0);
              ProKey::~ProKey((ProKey *)0x21f6fd);
              QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>::
              ~QStringBuilder((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>
                               *)0x21f70a);
              QStringBuilder<QString_&,_ProString>::~QStringBuilder
                        ((QStringBuilder<QString_&,_ProString> *)0x21f717);
              ProString::~ProString((ProString *)0x21f724);
              ProKey::~ProKey((ProKey *)0x21f731);
              ProKey::~ProKey((ProKey *)0x21f73e);
            }
            else {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((QString *)in_stack_ffffffffffff6ac8,
                          (ProString *)in_stack_ffffffffffff6ac0);
              ::operator+((QStringBuilder<QString_&,_ProString> *)in_stack_ffffffffffff6ac8,
                          (char (*) [2])in_stack_ffffffffffff6ac0);
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]> *
                          )in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
              ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                           *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                           *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
              ProString::
              ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                         (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                          *)in_stack_ffffffffffff6ac8);
              QList<ProString>::append
                        ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                         (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProString::~ProString((ProString *)0x21f92c);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)in_stack_ffffffffffff6ac0);
              ProString::~ProString((ProString *)0x21f946);
              ProKey::~ProKey((ProKey *)0x21f953);
              QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                 *)0x21f960);
              QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
              ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>
                                 *)in_stack_ffffffffffff6ac0);
              ProString::~ProString((ProString *)0x21f97a);
              ProKey::~ProKey((ProKey *)0x21f987);
              QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>::
              ~QStringBuilder((QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>
                               *)0x21f994);
              QStringBuilder<QString_&,_ProString>::~QStringBuilder
                        ((QStringBuilder<QString_&,_ProString> *)0x21f9a1);
              ProString::~ProString((ProString *)0x21f9ae);
              ProKey::~ProKey((ProKey *)0x21f9bb);
              ProKey::~ProKey((ProKey *)0x21f9c8);
            }
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProStringList::operator=
                      ((ProStringList *)in_stack_ffffffffffff6ac0,
                       (ProStringList *)
                       CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::~ProKey((ProKey *)0x21fa70);
            ProKey::~ProKey((ProKey *)0x21fa7d);
            QString::~QString((QString *)0x21fa8a);
          }
          else {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            bVar2 = QMakeProject::isEmpty
                              (in_stack_ffffffffffff6ad8,
                               (ProKey *)
                               CONCAT17(in_stack_ffffffffffff6ad7,
                                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0
                                                )));
            ProKey::~ProKey((ProKey *)0x21fae5);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              bVar2 = QMakeProject::isEmpty
                                (in_stack_ffffffffffff6ad8,
                                 (ProKey *)
                                 CONCAT17(in_stack_ffffffffffff6ad7,
                                          CONCAT16(in_stack_ffffffffffff6ad6,
                                                   in_stack_ffffffffffff6ad0)));
              ProKey::~ProKey((ProKey *)0x22026b);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ProString::ProString<char_const(&)[4],ProString>
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                           (QStringBuilder<const_char_(&)[4],_ProString> *)in_stack_ffffffffffff6ac8
                          );
                QList<ProString>::prepend
                          ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                           (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                          );
                ProString::~ProString((ProString *)0x221b28);
                QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)0x221b35);
                ProString::~ProString((ProString *)0x221b42);
                ProKey::~ProKey((ProKey *)0x221b4f);
                ProKey::~ProKey((ProKey *)0x221b5c);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                            in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                ProString::
                ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                            *)in_stack_ffffffffffff6ac8);
                QList<ProString>::append
                          ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                           (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                          );
                ProString::~ProString((ProString *)0x221cc3);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)in_stack_ffffffffffff6ac0);
                ProString::~ProString((ProString *)0x221cdd);
                ProKey::~ProKey((ProKey *)0x221cea);
                QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                 *)0x221cf7);
                QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)0x221d04);
                ProString::~ProString((ProString *)0x221d11);
                ProKey::~ProKey((ProKey *)0x221d1e);
                ProKey::~ProKey((ProKey *)0x221d2b);
                QString::QString((QString *)in_stack_ffffffffffff6ac8,
                                 (char *)in_stack_ffffffffffff6af8);
                bVar2 = QMakeProject::isActiveConfig
                                  (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                                   (bool)in_stack_ffffffffffff6abf);
                QString::~QString((QString *)0x221d81);
                if (bVar2) {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x221f79);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x221f93);
                  ProKey::~ProKey((ProKey *)0x221fa0);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x221fad);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x221fc7);
                  ProKey::~ProKey((ProKey *)0x221fd4);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x221fe1);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x221fee);
                  ProString::~ProString((ProString *)0x221ffb);
                  ProKey::~ProKey((ProKey *)0x222008);
                  ProKey::~ProKey((ProKey *)0x222015);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x22227e);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222298);
                  ProKey::~ProKey((ProKey *)0x2222a5);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2222b2);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x2222cc);
                  ProKey::~ProKey((ProKey *)0x2222d9);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2222e6);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222300);
                  ProKey::~ProKey((ProKey *)0x22230d);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x22231a);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x222327);
                  ProString::~ProString((ProString *)0x222334);
                  ProKey::~ProKey((ProKey *)0x222341);
                  ProKey::~ProKey((ProKey *)0x22234e);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x222638);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222652);
                  ProKey::~ProKey((ProKey *)0x22265f);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x22266c);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222686);
                  ProKey::~ProKey((ProKey *)0x222693);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2226a0);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x2226ba);
                  ProKey::~ProKey((ProKey *)0x2226c7);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2226d4);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x2226ee);
                  ProKey::~ProKey((ProKey *)0x2226fb);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x222708);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x222715);
                  ProString::~ProString((ProString *)0x222722);
                  ProKey::~ProKey((ProKey *)0x22272f);
                  ProKey::~ProKey((ProKey *)0x22273c);
                }
                else {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x222929);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222943);
                  ProKey::~ProKey((ProKey *)0x222950);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x22295d);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222977);
                  ProKey::~ProKey((ProKey *)0x222984);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x222991);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x22299e);
                  ProString::~ProString((ProString *)0x2229ab);
                  ProKey::~ProKey((ProKey *)0x2229b8);
                  ProKey::~ProKey((ProKey *)0x2229c5);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x222c2e);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222c48);
                  ProKey::~ProKey((ProKey *)0x222c55);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x222c62);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222c7c);
                  ProKey::~ProKey((ProKey *)0x222c89);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x222c96);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x222cb0);
                  ProKey::~ProKey((ProKey *)0x222cbd);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x222cca);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x222cd7);
                  ProString::~ProString((ProString *)0x222ce4);
                  ProKey::~ProKey((ProKey *)0x222cf1);
                  ProKey::~ProKey((ProKey *)0x222cfe);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x222fe8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x223002);
                  ProKey::~ProKey((ProKey *)0x22300f);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x22301c);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x223036);
                  ProKey::~ProKey((ProKey *)0x223043);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x223050);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x22306a);
                  ProKey::~ProKey((ProKey *)0x223077);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x223084);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x22309e);
                  ProKey::~ProKey((ProKey *)0x2230ab);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x2230b8);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x2230c5);
                  ProString::~ProString((ProString *)0x2230d2);
                  ProKey::~ProKey((ProKey *)0x2230df);
                  ProKey::~ProKey((ProKey *)0x2230ec);
                }
                QString::QString((QString *)in_stack_ffffffffffff6ac8,
                                 (char *)in_stack_ffffffffffff6af8);
                bVar2 = QMakeProject::isActiveConfig
                                  (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                                   (bool)in_stack_ffffffffffff6abf);
                QString::~QString((QString *)0x223142);
                if (bVar2) {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProStringList::operator=
                            ((ProStringList *)in_stack_ffffffffffff6ac0,
                             (ProStringList *)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProKey::~ProKey((ProKey *)0x2231fa);
                  ProKey::~ProKey((ProKey *)0x223207);
                }
                else {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProStringList::operator=
                            ((ProStringList *)in_stack_ffffffffffff6ac0,
                             (ProStringList *)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProKey::~ProKey((ProKey *)0x2232b4);
                  ProKey::~ProKey((ProKey *)0x2232c1);
                }
              }
              else {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ProString::ProString<char_const(&)[4],ProString>
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                           (QStringBuilder<const_char_(&)[4],_ProString> *)in_stack_ffffffffffff6ac8
                          );
                QList<ProString>::prepend
                          ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                           (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                          );
                ProString::~ProString((ProString *)0x220361);
                QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)0x22036e);
                ProString::~ProString((ProString *)0x22037b);
                ProKey::~ProKey((ProKey *)0x220388);
                ProKey::~ProKey((ProKey *)0x220395);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((ProString *)in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ::operator+((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac8,
                            (char (*) [2])in_stack_ffffffffffff6ac0);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                             *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                ProString::
                ProString<QStringBuilder<QStringBuilder<ProString,ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                           (QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                            *)in_stack_ffffffffffff6ac8);
                QList<ProString>::append
                          ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                           (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                          );
                ProString::~ProString((ProString *)0x220545);
                QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)in_stack_ffffffffffff6ac0);
                ProString::~ProString((ProString *)0x22055f);
                ProKey::~ProKey((ProKey *)0x22056c);
                QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>::
                ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>
                                 *)0x220579);
                QStringBuilder<ProString,_ProString>::~QStringBuilder
                          ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac0);
                ProString::~ProString((ProString *)0x220593);
                ProKey::~ProKey((ProKey *)0x2205a0);
                ProString::~ProString((ProString *)0x2205ad);
                ProKey::~ProKey((ProKey *)0x2205ba);
                ProKey::~ProKey((ProKey *)0x2205c7);
                QString::QString((QString *)in_stack_ffffffffffff6ac8,
                                 (char *)in_stack_ffffffffffff6af8);
                bVar2 = QMakeProject::isActiveConfig
                                  (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                                   (bool)in_stack_ffffffffffff6abf);
                QString::~QString((QString *)0x22061d);
                if (bVar2) {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x220815);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x22082f);
                  ProKey::~ProKey((ProKey *)0x22083c);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x220849);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220863);
                  ProKey::~ProKey((ProKey *)0x220870);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x22087d);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x22088a);
                  ProString::~ProString((ProString *)0x220897);
                  ProKey::~ProKey((ProKey *)0x2208a4);
                  ProKey::~ProKey((ProKey *)0x2208b1);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x220b1a);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220b34);
                  ProKey::~ProKey((ProKey *)0x220b41);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x220b4e);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220b68);
                  ProKey::~ProKey((ProKey *)0x220b75);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x220b82);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220b9c);
                  ProKey::~ProKey((ProKey *)0x220ba9);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x220bb6);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x220bc3);
                  ProString::~ProString((ProString *)0x220bd0);
                  ProKey::~ProKey((ProKey *)0x220bdd);
                  ProKey::~ProKey((ProKey *)0x220bea);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x220ed4);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220eee);
                  ProKey::~ProKey((ProKey *)0x220efb);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x220f08);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220f22);
                  ProKey::~ProKey((ProKey *)0x220f2f);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x220f3c);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220f56);
                  ProKey::~ProKey((ProKey *)0x220f63);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x220f70);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x220f8a);
                  ProKey::~ProKey((ProKey *)0x220f97);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x220fa4);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x220fb1);
                  ProString::~ProString((ProString *)0x220fbe);
                  ProKey::~ProKey((ProKey *)0x220fcb);
                  ProKey::~ProKey((ProKey *)0x220fd8);
                }
                else {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x2211c5);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x2211df);
                  ProKey::~ProKey((ProKey *)0x2211ec);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2211f9);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x221213);
                  ProKey::~ProKey((ProKey *)0x221220);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x22122d);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x22123a);
                  ProString::~ProString((ProString *)0x221247);
                  ProKey::~ProKey((ProKey *)0x221254);
                  ProKey::~ProKey((ProKey *)0x221261);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x2214ca);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x2214e4);
                  ProKey::~ProKey((ProKey *)0x2214f1);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2214fe);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x221518);
                  ProKey::~ProKey((ProKey *)0x221525);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x221532);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x22154c);
                  ProKey::~ProKey((ProKey *)0x221559);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x221566);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x221573);
                  ProString::~ProString((ProString *)0x221580);
                  ProKey::~ProKey((ProKey *)0x22158d);
                  ProKey::~ProKey((ProKey *)0x22159a);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeProject::values
                            (in_stack_ffffffffffff6ac0,
                             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                            );
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                              (ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                              in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                               *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                  ProString::
                  ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                             ,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac8);
                  QList<ProString>::append
                            ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                             (rvalue_ref)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x221884);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x22189e);
                  ProKey::~ProKey((ProKey *)0x2218ab);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2218b8);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x2218d2);
                  ProKey::~ProKey((ProKey *)0x2218df);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x2218ec);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x221906);
                  ProKey::~ProKey((ProKey *)0x221913);
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                                     *)0x221920);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                     *)in_stack_ffffffffffff6ac0);
                  ProString::~ProString((ProString *)0x22193a);
                  ProKey::~ProKey((ProKey *)0x221947);
                  QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                  ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                   *)0x221954);
                  QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                            ((QStringBuilder<const_char_(&)[4],_ProString> *)0x221961);
                  ProString::~ProString((ProString *)0x22196e);
                  ProKey::~ProKey((ProKey *)0x22197b);
                  ProKey::~ProKey((ProKey *)0x221988);
                }
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProStringList::operator=
                          ((ProStringList *)in_stack_ffffffffffff6ac0,
                           (ProStringList *)
                           CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::~ProKey((ProKey *)0x221a30);
                ProKey::~ProKey((ProKey *)0x221a3d);
              }
            }
            else {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                          (ProString *)in_stack_ffffffffffff6ac0);
              ProString::ProString<char_const(&)[4],ProString>
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                         (QStringBuilder<const_char_(&)[4],_ProString> *)in_stack_ffffffffffff6ac8);
              QList<ProString>::prepend
                        ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                         (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProString::~ProString((ProString *)0x21fbdb);
              QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                        ((QStringBuilder<const_char_(&)[4],_ProString> *)0x21fbe8);
              ProString::~ProString((ProString *)0x21fbf5);
              ProKey::~ProKey((ProKey *)0x21fc02);
              ProKey::~ProKey((ProKey *)0x21fc0f);
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                          (ProString *)in_stack_ffffffffffff6ac0);
              ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)in_stack_ffffffffffff6ac8,
                          (char (*) [4])in_stack_ffffffffffff6ac0);
              ProString::ProString<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[4]>
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                         (QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[4]>
                          *)in_stack_ffffffffffff6ac8);
              QList<ProString>::append
                        ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                         (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProString::~ProString((ProString *)0x21fd11);
              QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[4]>::
              ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[4]>
                               *)0x21fd1e);
              QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                        ((QStringBuilder<const_char_(&)[4],_ProString> *)0x21fd2b);
              ProString::~ProString((ProString *)0x21fd38);
              ProKey::~ProKey((ProKey *)0x21fd45);
              ProKey::~ProKey((ProKey *)0x21fd52);
              QString::QString((QString *)in_stack_ffffffffffff6ac8,
                               (char *)in_stack_ffffffffffff6af8);
              bVar2 = QMakeProject::isActiveConfig
                                (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                                 (bool)in_stack_ffffffffffff6abf);
              QString::~QString((QString *)0x21fda8);
              if (bVar2) {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                            in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                ProString::
                ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                            *)in_stack_ffffffffffff6ac8);
                QList<ProString>::append
                          ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                           (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                          );
                ProString::~ProString((ProString *)0x21ff1f);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)in_stack_ffffffffffff6ac0);
                ProString::~ProString((ProString *)0x21ff39);
                ProKey::~ProKey((ProKey *)0x21ff46);
                QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                 *)0x21ff53);
                QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)0x21ff60);
                ProString::~ProString((ProString *)0x21ff6d);
                ProKey::~ProKey((ProKey *)0x21ff7a);
                ProKey::~ProKey((ProKey *)0x21ff87);
              }
              else {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                            in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                ProString::
                ProString<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                            *)in_stack_ffffffffffff6ac8);
                QList<ProString>::append
                          ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                           (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                          );
                ProString::~ProString((ProString *)0x2200f3);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)in_stack_ffffffffffff6ac0);
                ProString::~ProString((ProString *)0x22010d);
                ProKey::~ProKey((ProKey *)0x22011a);
                QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                 *)0x220127);
                QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)0x220134);
                ProString::~ProString((ProString *)0x220141);
                ProKey::~ProKey((ProKey *)0x22014e);
                ProKey::~ProKey((ProKey *)0x22015b);
              }
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProStringList::operator=
                        ((ProStringList *)in_stack_ffffffffffff6ac0,
                         (ProStringList *)
                         CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProKey::~ProKey((ProKey *)0x220203);
              ProKey::~ProKey((ProKey *)0x220210);
            }
          }
        }
        else {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((ProString *)in_stack_ffffffffffff6ac8,
                      (char (*) [11])in_stack_ffffffffffff6ac0);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((QStringBuilder<ProString,_const_char_(&)[11]> *)in_stack_ffffffffffff6ac8,
                      (ProString *)in_stack_ffffffffffff6ac0);
          ::operator+((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                      in_stack_ffffffffffff6ac8,(char (*) [12])in_stack_ffffffffffff6ac0);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>
                       *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
          ProString::
          ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,char_const(&)[12]>,ProString>
                    ((ProString *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                      *)in_stack_ffffffffffff6ac8);
          QList<ProString>::prepend
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::~ProString((ProString *)0x21e965);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>,_ProString>
                             *)in_stack_ffffffffffff6ac0);
          ProString::~ProString((ProString *)0x21e97f);
          ProKey::~ProKey((ProKey *)0x21e98c);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_const_char_(&)[12]>
                             *)0x21e999);
          QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                     in_stack_ffffffffffff6ac0);
          ProString::~ProString((ProString *)0x21e9b3);
          ProKey::~ProKey((ProKey *)0x21e9c0);
          QStringBuilder<ProString,_const_char_(&)[11]>::~QStringBuilder
                    ((QStringBuilder<ProString,_const_char_(&)[11]> *)0x21e9cd);
          ProString::~ProString((ProString *)0x21e9da);
          ProKey::~ProKey((ProKey *)0x21e9e7);
          ProKey::~ProKey((ProKey *)0x21e9f4);
          memset(local_1038,0xaa,0x30);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ProKey::~ProKey((ProKey *)0x21ea60);
          bVar2 = ProString::isEmpty(local_1038);
          if ((!bVar2) &&
             (bVar2 = ProString::startsWith
                                ((ProString *)
                                 CONCAT17(in_stack_ffffffffffff6ad7,
                                          CONCAT16(in_stack_ffffffffffff6ad6,
                                                   in_stack_ffffffffffff6ad0)),
                                 (char *)in_stack_ffffffffffff6ac8,
                                 (CaseSensitivity)((ulong)in_stack_ffffffffffff6ac0 >> 0x20)),
             !bVar2)) {
            ProString::ProString
                      ((ProString *)in_stack_ffffffffffff6ac0,(char *)in_stack_ffffffffffff6ad8);
            ProString::prepend((ProString *)
                               CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                               (ProString *)in_stack_ffffffffffff6ad8);
            ProString::~ProString((ProString *)0x21eac4);
          }
          bVar2 = ProString::endsWith((ProString *)
                                      CONCAT17(in_stack_ffffffffffff6ad7,
                                               CONCAT16(in_stack_ffffffffffff6ad6,
                                                        in_stack_ffffffffffff6ad0)),
                                      (char *)in_stack_ffffffffffff6ac8,
                                      (CaseSensitivity)((ulong)in_stack_ffffffffffff6ac0 >> 0x20));
          if (!bVar2) {
            ProString::operator+=
                      ((ProString *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          }
          local_10b0 = 0xaaaaaaaaaaaaaaaa;
          local_10a8 = 0xaaaaaaaaaaaaaaaa;
          local_10a0 = 0xaaaaaaaaaaaaaaaa;
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((ProString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0)
          ;
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((QStringBuilder<ProString,_ProString_&> *)in_stack_ffffffffffff6ac8,
                      (ProString *)in_stack_ffffffffffff6ac0);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)
                     CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_ProString> *)
                     in_stack_ffffffffffff6ac0);
          ProString::~ProString((ProString *)0x21ec1b);
          ProKey::~ProKey((ProKey *)0x21ec28);
          QStringBuilder<ProString,_ProString_&>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString_&> *)0x21ec35);
          ProString::~ProString((ProString *)0x21ec42);
          ProKey::~ProKey((ProKey *)0x21ec4f);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffff6ac0,
                     (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::~ProString((ProString *)0x21ecce);
          ProKey::~ProKey((ProKey *)0x21ecdb);
          QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
          bVar2 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                             (bool)in_stack_ffffffffffff6abf);
          QString::~QString((QString *)0x21ed33);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::ProString
                      ((ProString *)in_stack_ffffffffffff6ac0,
                       (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QList<ProString>::append
                      ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                       (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::~ProString((ProString *)0x21f023);
            ProKey::~ProKey((ProKey *)0x21f030);
          }
          else {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((ProString *)in_stack_ffffffffffff6ac8,
                        (char (*) [11])in_stack_ffffffffffff6ac0);
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((QStringBuilder<ProString,_const_char_(&)[11]> *)in_stack_ffffffffffff6ac8,
                        (ProString *)in_stack_ffffffffffff6ac0);
            ::operator+((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)
                        in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>
                         *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
            ProString::
            ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,char_const(&)[11]>,ProString>,ProString&>,ProString>
                      ((ProString *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                        *)in_stack_ffffffffffff6ac8);
            QList<ProString>::append
                      ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                       (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::~ProString((ProString *)0x21ef10);
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                               *)in_stack_ffffffffffff6ac0);
            ProString::~ProString((ProString *)0x21ef2a);
            ProKey::~ProKey((ProKey *)0x21ef37);
            QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>
                               *)0x21ef44);
            QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::
            ~QStringBuilder((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>
                             *)in_stack_ffffffffffff6ac0);
            ProString::~ProString((ProString *)0x21ef5e);
            ProKey::~ProKey((ProKey *)0x21ef6b);
            QStringBuilder<ProString,_const_char_(&)[11]>::~QStringBuilder
                      ((QStringBuilder<ProString,_const_char_(&)[11]> *)0x21ef78);
            ProString::~ProString((ProString *)0x21ef85);
            ProKey::~ProKey((ProKey *)0x21ef92);
            ProKey::~ProKey((ProKey *)0x21ef9f);
          }
          QString::~QString((QString *)0x21f03d);
          ProString::~ProString((ProString *)0x21f04a);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x223311);
        ProKey::~ProKey((ProKey *)0x223327);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          memset(local_7400,0xaa,0x30);
          ProString::ProString((ProString *)in_stack_ffffffffffff6ac0);
          QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
          bVar2 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                             (bool)in_stack_ffffffffffff6abf);
          QString::~QString((QString *)0x2233b1);
          if (bVar2) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x223409);
            ProKey::~ProKey((ProKey *)0x22341f);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ProString::operator+=
                        ((ProString *)in_stack_ffffffffffff6ac0,
                         (ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8))
              ;
              ProString::~ProString((ProString *)0x223496);
              ProKey::~ProKey((ProKey *)0x2234a3);
            }
          }
          else {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            bVar2 = QMakeProject::isEmpty
                              (in_stack_ffffffffffff6ad8,
                               (ProKey *)
                               CONCAT17(in_stack_ffffffffffff6ad7,
                                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0
                                                )));
            ProKey::~ProKey((ProKey *)0x2234fe);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              QString::QString((QString *)in_stack_ffffffffffff6ac8,
                               (char *)in_stack_ffffffffffff6af8);
              bVar2 = QMakeProject::isActiveConfig
                                (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                                 (bool)in_stack_ffffffffffff6abf);
              QString::~QString((QString *)0x2235dd);
              if (bVar2) {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((char (*) [4])in_stack_ffffffffffff6ac8,
                            (ProString *)in_stack_ffffffffffff6ac0);
                ::operator+((QStringBuilder<const_char_(&)[4],_ProString> *)
                            in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                             *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
                ProString::operator=
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                            *)in_stack_ffffffffffff6ad8);
                QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>
                                   *)in_stack_ffffffffffff6ac0);
                ProString::~ProString((ProString *)0x223701);
                ProKey::~ProKey((ProKey *)0x22370e);
                QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>::
                ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>
                                 *)0x22371b);
                QStringBuilder<const_char_(&)[4],_ProString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[4],_ProString> *)0x223728);
                ProString::~ProString((ProString *)0x223735);
                ProKey::~ProKey((ProKey *)0x223742);
              }
              else {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeProject::values
                          (in_stack_ffffffffffff6ac0,
                           (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x22378f);
                ProKey::~ProKey((ProKey *)0x2237a5);
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                                 (char *)CONCAT17(in_stack_ffffffffffff6abf,
                                                  in_stack_ffffffffffff6ab8));
                  QMakeEvaluator::first
                            (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
                  ProString::operator+=
                            ((ProString *)in_stack_ffffffffffff6ac0,
                             (ProString *)
                             CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  ProString::~ProString((ProString *)0x22381c);
                  ProKey::~ProKey((ProKey *)0x223829);
                }
              }
            }
            else {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ProString::operator+=
                        ((ProString *)in_stack_ffffffffffff6ac0,
                         (ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8))
              ;
              ProString::~ProString((ProString *)0x223575);
              ProKey::~ProKey((ProKey *)0x223582);
            }
          }
          bVar2 = ProString::isEmpty(local_7400);
          if (!bVar2) {
            QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8)
            ;
            bVar3 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                               (bool)in_stack_ffffffffffff6abf);
            bVar1 = false;
            bVar2 = false;
            local_9299 = 0;
            if (bVar3) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              bVar1 = true;
              QMakeProject::values
                        (in_stack_ffffffffffff6ac0,
                         (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              qVar4 = QListSpecialMethodsBase<ProString>::indexOf<char[7]>
                                ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffff6ac0,
                                 (char (*) [7])
                                 CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8),
                                 0x223906);
              local_9299 = 0;
              if (qVar4 != -1) {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                bVar2 = true;
                bVar3 = QMakeProject::isEmpty
                                  (in_stack_ffffffffffff6ad8,
                                   (ProKey *)
                                   CONCAT17(in_stack_ffffffffffff6ad7,
                                            CONCAT16(in_stack_ffffffffffff6ad6,
                                                     in_stack_ffffffffffff6ad0)));
                local_9299 = bVar3 ^ 0xff;
              }
            }
            if (bVar2) {
              ProKey::~ProKey((ProKey *)0x223990);
            }
            if (bVar1) {
              ProKey::~ProKey((ProKey *)0x2239a9);
            }
            QString::~QString((QString *)0x2239b6);
            if ((local_9299 & 1) == 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              bVar2 = QMakeProject::isEmpty
                                (in_stack_ffffffffffff6ad8,
                                 (ProKey *)
                                 CONCAT17(in_stack_ffffffffffff6ad7,
                                          CONCAT16(in_stack_ffffffffffff6ad6,
                                                   in_stack_ffffffffffff6ad0)));
              ProKey::~ProKey((ProKey *)0x223b63);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                local_7908 = 0xaaaaaaaaaaaaaaaa;
                local_7900 = 0xaaaaaaaaaaaaaaaa;
                local_78f8 = 0xaaaaaaaaaaaaaaaa;
                ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                               (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                              );
                QMakeEvaluator::first
                          (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
                ProString::toQString
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                ProString::~ProString((ProString *)0x223c0a);
                ProKey::~ProKey((ProKey *)0x223c17);
                QChar::QChar<char,_true>(local_796a,'@');
                uVar5 = QString::startsWith((QChar)(char16_t)&local_7908,
                                            (uint)(ushort)local_796a[0].ucs);
                if ((uVar5 & 1) == 0) {
                  Option::fixPathToTargetOS
                            ((QString *)in_stack_ffffffffffff6ad8,(bool)in_stack_ffffffffffff6ad7,
                             (bool)in_stack_ffffffffffff6ad6);
                  QString::operator=((QString *)in_stack_ffffffffffff6ac0,
                                     (QString *)
                                     CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
                  QString::~QString((QString *)0x223c85);
                }
                uVar5 = QString::endsWith((QString *)&local_7908,0x3bdbd8);
                if ((uVar5 & 1) == 0) {
                  QString::operator+=((QString *)in_stack_ffffffffffff6ac0,
                                      (QString *)
                                      CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8))
                  ;
                }
                ProString::ProString
                          ((ProString *)in_stack_ffffffffffff6ac0,
                           (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8))
                ;
                ProString::prepend((ProString *)
                                   CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                                   (ProString *)in_stack_ffffffffffff6ad8);
                ProString::~ProString((ProString *)0x223ced);
                QString::~QString((QString *)0x223cfa);
              }
            }
            else {
              local_7818 = 0xaaaaaaaaaaaaaaaa;
              local_7810 = 0xaaaaaaaaaaaaaaaa;
              local_7808 = 0xaaaaaaaaaaaaaaaa;
              ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                             (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              QMakeEvaluator::first
                        (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
              ProString::toQString
                        ((ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8))
              ;
              Option::fixPathToTargetOS
                        ((QString *)in_stack_ffffffffffff6ad8,(bool)in_stack_ffffffffffff6ad7,
                         (bool)in_stack_ffffffffffff6ad6);
              QString::~QString((QString *)0x223a79);
              ProString::~ProString((ProString *)0x223a86);
              ProKey::~ProKey((ProKey *)0x223a93);
              uVar5 = QString::endsWith((QString *)&local_7818,0x3bdbd8);
              if ((uVar5 & 1) == 0) {
                QString::operator+=((QString *)in_stack_ffffffffffff6ac0,
                                    (QString *)
                                    CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              }
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffff6ac0,
                         (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
              ProString::prepend((ProString *)
                                 CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                                 (ProString *)in_stack_ffffffffffff6ad8);
              ProString::~ProString((ProString *)0x223afb);
              QString::~QString((QString *)0x223b08);
            }
            MakefileGenerator::escapeFilePath
                      ((MakefileGenerator *)
                       CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                       (ProString *)in_stack_ffffffffffff6ad8);
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffff6ac0);
            ProString::operator+=
                      ((ProString *)in_stack_ffffffffffff6ac0,
                       (ProString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::~ProKey((ProKey *)0x223d7e);
            ProString::~ProString((ProString *)0x223d8b);
          }
          ProString::~ProString((ProString *)0x223d98);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x223de0);
        ProKey::~ProKey((ProKey *)0x223df4);
        if (bVar2) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((char (*) [19])in_stack_ffffffffffff6ac8,
                      (ProString *)in_stack_ffffffffffff6ac0);
          ::operator+((QStringBuilder<const_char_(&)[19],_ProString> *)in_stack_ffffffffffff6ac8,
                      (char (*) [40])in_stack_ffffffffffff6ac0);
          ProString::ProString<QStringBuilder<char_const(&)[19],ProString>,char_const(&)[40]>
                    ((ProString *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                     (QStringBuilder<QStringBuilder<const_char_(&)[19],_ProString>,_const_char_(&)[40]>
                      *)in_stack_ffffffffffff6ac8);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::~ProString((ProString *)0x223f06);
          QStringBuilder<QStringBuilder<const_char_(&)[19],_ProString>,_const_char_(&)[40]>::
          ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[19],_ProString>,_const_char_(&)[40]>
                           *)0x223f13);
          QStringBuilder<const_char_(&)[19],_ProString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[19],_ProString> *)0x223f20);
          ProString::~ProString((ProString *)0x223f2d);
          ProKey::~ProKey((ProKey *)0x223f3a);
          ProKey::~ProKey((ProKey *)0x223f47);
        }
      }
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                     (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
      bVar2 = QMakeProject::isEmpty
                        (in_stack_ffffffffffff6ad8,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
      ProKey::~ProKey((ProKey *)0x21dbb4);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        memset(local_350,0xaa,0x30);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProKey::~ProKey((ProKey *)0x21dc30);
        bVar2 = ProString::isEmpty(local_350);
        if ((!bVar2) &&
           (bVar2 = ProString::startsWith
                              ((ProString *)
                               CONCAT17(in_stack_ffffffffffff6ad7,
                                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0
                                                )),(char *)in_stack_ffffffffffff6ac8,
                               (CaseSensitivity)((ulong)in_stack_ffffffffffff6ac0 >> 0x20)), !bVar2)
           ) {
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffff6ac0,(char *)in_stack_ffffffffffff6ad8);
          ProString::prepend((ProString *)
                             CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                             (ProString *)in_stack_ffffffffffff6ad8);
          ProString::~ProString((ProString *)0x21dc94);
        }
        bVar2 = ProString::endsWith((ProString *)
                                    CONCAT17(in_stack_ffffffffffff6ad7,
                                             CONCAT16(in_stack_ffffffffffff6ad6,
                                                      in_stack_ffffffffffff6ad0)),
                                    (char *)in_stack_ffffffffffff6ac8,
                                    (CaseSensitivity)((ulong)in_stack_ffffffffffff6ac0 >> 0x20));
        if (!bVar2) {
          ProString::operator+=
                    ((ProString *)in_stack_ffffffffffff6ac0,
                     (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffff6ac0);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ::operator+((ProString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
        ProString::ProString<ProString,ProString&>
                  ((ProString *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)),
                   (QStringBuilder<ProString,_ProString_&> *)in_stack_ffffffffffff6ac8);
        ProString::prepend((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                           (ProString *)in_stack_ffffffffffff6ad8);
        ProString::~ProString((ProString *)0x21ddb4);
        QStringBuilder<ProString,_ProString_&>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString_&> *)0x21ddc1);
        ProString::~ProString((ProString *)0x21ddce);
        ProKey::~ProKey((ProKey *)0x21dddb);
        ProKey::~ProKey((ProKey *)0x21dde8);
        ProString::~ProString((ProString *)0x21ddf5);
      }
      ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                     (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
      bVar2 = QMakeProject::isEmpty
                        (in_stack_ffffffffffff6ad8,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffff6ad7,
                                  CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
      ProKey::~ProKey((ProKey *)0x21de4b);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::first((QList<ProString> *)in_stack_ffffffffffff6ac0);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffff6ad7,
                            CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProString::prepend((ProString *)
                           CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                           (ProString *)in_stack_ffffffffffff6ad8);
        ProString::~ProString((ProString *)0x21df18);
        ProKey::~ProKey((ProKey *)0x21df25);
        ProKey::~ProKey((ProKey *)0x21df32);
      }
    }
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                 (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
  QMakeProject::values
            (in_stack_ffffffffffff6ac0,
             (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
  bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x223f95);
  local_9311 = true;
  if (bVar2) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffff6ad7,
                        CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
    local_9311 = ProString::operator==
                           ((ProString *)
                            CONCAT17(in_stack_ffffffffffff6ae7,in_stack_ffffffffffff6ae0),
                            (char *)in_stack_ffffffffffff6ad8);
    ProString::~ProString((ProString *)0x224051);
    ProKey::~ProKey((ProKey *)0x22406a);
  }
  ProKey::~ProKey((ProKey *)0x224077);
  if (local_9311 == false) {
    QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
    bVar2 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                       (bool)in_stack_ffffffffffff6abf);
    QString::~QString((QString *)0x224301);
    if (bVar2) {
      QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
      bVar2 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                         (bool)in_stack_ffffffffffff6abf);
      local_9389 = 1;
      if (bVar2) {
        QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
        bVar2 = QMakeProject::isActiveConfig
                          (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                           (bool)in_stack_ffffffffffff6abf);
        local_9389 = bVar2 ^ 0xff;
        QString::~QString((QString *)0x2243e7);
      }
      QString::~QString((QString *)0x2243f4);
      if ((local_9389 & 1) != 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x2244ac);
        ProKey::~ProKey((ProKey *)0x2244b9);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x224561);
        ProKey::~ProKey((ProKey *)0x22456e);
      }
      QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
      bVar2 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                         (bool)in_stack_ffffffffffff6abf);
      QString::~QString((QString *)0x2245c4);
      if (bVar2) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x22467c);
        ProKey::~ProKey((ProKey *)0x224689);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x224731);
        ProKey::~ProKey((ProKey *)0x22473e);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x2247e6);
        ProKey::~ProKey((ProKey *)0x2247f3);
        QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
        bVar2 = QMakeProject::isActiveConfig
                          (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                           (bool)in_stack_ffffffffffff6abf);
        QString::~QString((QString *)0x224849);
        if (bVar2) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (QList<ProString> *)
                     CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProKey::~ProKey((ProKey *)0x224901);
          ProKey::~ProKey((ProKey *)0x22490e);
        }
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x2249bb);
        ProKey::~ProKey((ProKey *)0x2249c8);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        bVar2 = QMakeProject::isEmpty
                          (in_stack_ffffffffffff6ad8,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProKey::~ProKey((ProKey *)0x224a1e);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          bVar2 = QMakeProject::isEmpty
                            (in_stack_ffffffffffff6ad8,
                             (ProKey *)
                             CONCAT17(in_stack_ffffffffffff6ad7,
                                      CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0))
                            );
          ProKey::~ProKey((ProKey *)0x224a82);
          if (bVar2) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((ProString *)in_stack_ffffffffffff6ac8,
                        (ProString *)in_stack_ffffffffffff6ac0);
            ::operator+((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac8,
                        (char (*) [2])in_stack_ffffffffffff6ac0);
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                        in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                        *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::ProString
                      ((ProString *)in_stack_ffffffffffff6ac0,
                       (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QList<ProString>::operator+=
                      ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                       (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::~ProKey((ProKey *)0x224c47);
            ProString::~ProString((ProString *)0x224c54);
            QString::~QString((QString *)0x224c61);
            QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
            ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                               *)in_stack_ffffffffffff6ac0);
            ProString::~ProString((ProString *)0x224c7b);
            ProKey::~ProKey((ProKey *)0x224c88);
            QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>::~QStringBuilder
                      ((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                       0x224c95);
            QStringBuilder<ProString,_ProString>::~QStringBuilder
                      ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac0);
            ProString::~ProString((ProString *)0x224caf);
            ProKey::~ProKey((ProKey *)0x224cbc);
            ProString::~ProString((ProString *)0x224cc9);
            ProKey::~ProKey((ProKey *)0x224cd6);
          }
          else {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffff6ad7,
                                CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
            ::operator+((ProString *)in_stack_ffffffffffff6ac8,
                        (ProString *)in_stack_ffffffffffff6ac0);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<ProString,_ProString> *)
                       CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProString::ProString
                      ((ProString *)in_stack_ffffffffffff6ac0,
                       (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                           (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QMakeProject::values
                      (in_stack_ffffffffffff6ac0,
                       (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            QList<ProString>::operator+=
                      ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                       (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
            ProKey::~ProKey((ProKey *)0x224e0f);
            ProString::~ProString((ProString *)0x224e1c);
            QString::~QString((QString *)0x224e29);
            QStringBuilder<ProString,_ProString>::~QStringBuilder
                      ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac0);
            ProString::~ProString((ProString *)0x224e43);
            ProKey::~ProKey((ProKey *)0x224e50);
            ProString::~ProString((ProString *)0x224e5d);
            ProKey::~ProKey((ProKey *)0x224e6a);
          }
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        bVar2 = QMakeProject::isEmpty
                          (in_stack_ffffffffffff6ad8,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffff6ad7,
                                    CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
        ProKey::~ProKey((ProKey *)0x224eb9);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((ProString *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0)
          ;
          ::operator+((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac8,
                      (char (*) [2])in_stack_ffffffffffff6ac0);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                      in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                       *)in_stack_ffffffffffff6ac8,(char (*) [2])in_stack_ffffffffffff6ac0);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffff6ad8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffff6ad7,
                              CONCAT16(in_stack_ffffffffffff6ad6,in_stack_ffffffffffff6ad0)));
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                       *)in_stack_ffffffffffff6ac8,(ProString *)in_stack_ffffffffffff6ac0);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                      *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffff6ac0,
                     (QString *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                         (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QMakeProject::values
                    (in_stack_ffffffffffff6ac0,
                     (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          QList<ProString>::operator+=
                    ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                     (rvalue_ref)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
          ProKey::~ProKey((ProKey *)0x2250de);
          ProString::~ProString((ProString *)0x2250eb);
          QString::~QString((QString *)0x2250f8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)in_stack_ffffffffffff6ac0);
          ProString::~ProString((ProString *)0x225112);
          ProKey::~ProKey((ProKey *)0x22511f);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>
                             *)0x22512c);
          QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                             *)in_stack_ffffffffffff6ac0);
          ProString::~ProString((ProString *)0x225146);
          ProKey::~ProKey((ProKey *)0x225153);
          QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)
                     0x225160);
          QStringBuilder<ProString,_ProString>::~QStringBuilder
                    ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffff6ac0);
          ProString::~ProString((ProString *)0x22517a);
          ProKey::~ProKey((ProKey *)0x225187);
          ProString::~ProString((ProString *)0x225194);
          ProKey::~ProKey((ProKey *)0x2251a1);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        in_stack_ffffffffffff6af8 =
             QMakeProject::values
                       (in_stack_ffffffffffff6ac0,
                        (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                       (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QMakeProject::values
                  (in_stack_ffffffffffff6ac0,
                   (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffff6ac0,
                   (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8)
                  );
        ProKey::~ProKey((ProKey *)0x225237);
        ProKey::~ProKey((ProKey *)0x225244);
      }
    }
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffff6ac0,
               (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::~ProKey((ProKey *)0x22412f);
    ProKey::~ProKey((ProKey *)0x22413c);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffff6ac0,
               (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::~ProKey((ProKey *)0x2241e4);
    ProKey::~ProKey((ProKey *)0x2241f1);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::ProKey((ProKey *)in_stack_ffffffffffff6ac0,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (in_stack_ffffffffffff6ac0,
               (ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffff6ac0,
               (QList<ProString> *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::~ProKey((ProKey *)0x224299);
    ProKey::~ProKey((ProKey *)0x2242a6);
  }
  bVar6 = 0;
  if ((*(byte *)(in_RDI + 0xe0) & 1) != 0) {
    in_stack_ffffffffffff6ad8 = *(QMakeProject **)(in_RDI + 0xd8);
    QString::QString((QString *)in_stack_ffffffffffff6ac8,(char *)in_stack_ffffffffffff6af8);
    bVar6 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffff6ac8,(QString *)in_stack_ffffffffffff6ac0,
                       (bool)in_stack_ffffffffffff6abf);
    QString::~QString((QString *)0x2252d2);
  }
  if ((bVar6 & 1) != 0) {
    memset(local_8ad8,0xaa,0x30);
    ProString::ProString((ProString *)in_stack_ffffffffffff6ac0,(char *)in_stack_ffffffffffff6ad8);
    this_00 = *(QMakeProject **)(in_RDI + 0xd8);
    ProKey::ProKey((ProKey *)this_00,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (this_00,(ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QList<ProString>::operator+=
              ((QList<ProString> *)this_00,
               (parameter_type)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::~ProKey((ProKey *)0x225361);
    ProKey::ProKey((ProKey *)this_00,
                   (char *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QMakeProject::values
              (this_00,(ProKey *)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    QList<ProString>::operator+=
              ((QList<ProString> *)this_00,
               (parameter_type)CONCAT17(in_stack_ffffffffffff6abf,in_stack_ffffffffffff6ab8));
    ProKey::~ProKey((ProKey *)0x2253b8);
    ProString::~ProString((ProString *)0x2253c5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnixMakefileGenerator::init2()
{
    if(project->isEmpty("QMAKE_FRAMEWORK_VERSION"))
        project->values("QMAKE_FRAMEWORK_VERSION").append(project->first("VER_MAJ"));

    if (project->first("TEMPLATE") == "aux") {
        project->values("PRL_TARGET") = {
            project->first("QMAKE_PREFIX_STATICLIB") +
            project->first("TARGET")
        };
    } else if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if(!project->isEmpty("QMAKE_BUNDLE")) {
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            project->values("TARGET").first().prepend(project->first("QMAKE_BUNDLE") + bundle_loc);
        }
        if(!project->isEmpty("TARGET"))
            project->values("TARGET").first().prepend(project->first("DESTDIR"));
    } else if (project->isActiveConfig("staticlib")) {
        project->values("PRL_TARGET") =
            project->values("TARGET").first().prepend(project->first("QMAKE_PREFIX_STATICLIB"));
        project->values("TARGET").first() += "." + project->first("QMAKE_EXTENSION_STATICLIB");
        if(project->values("QMAKE_AR_CMD").isEmpty())
            project->values("QMAKE_AR_CMD").append("$(AR) $(DESTDIR)$(TARGET) $(OBJECTS)");
    } else {
        project->values("TARGETA").append(project->first("DESTDIR") + project->first("QMAKE_PREFIX_STATICLIB")
                + project->first("TARGET") + "." + project->first("QMAKE_EXTENSION_STATICLIB"));

        ProStringList &ar_cmd = project->values("QMAKE_AR_CMD");
        if (!ar_cmd.isEmpty())
            ar_cmd[0] = ar_cmd.at(0).toQString().replace(QLatin1String("(TARGET)"), QLatin1String("(TARGETA)"));
        else
            ar_cmd.append("$(AR) $(TARGETA) $(OBJECTS)");
        if (!project->isEmpty("QMAKE_BUNDLE")) {
            project->values("PRL_TARGET").prepend(project->first("QMAKE_BUNDLE") +
                "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION") +
                "/Resources/" + project->first("TARGET"));
            ProString bundle_loc = project->first("QMAKE_BUNDLE_LOCATION");
            if(!bundle_loc.isEmpty() && !bundle_loc.startsWith("/"))
                bundle_loc.prepend("/");
            if(!bundle_loc.endsWith("/"))
                bundle_loc += "/";
            const QString target = project->first("QMAKE_BUNDLE") +
                                        bundle_loc + project->first("TARGET");
            project->values("TARGET_").append(target);
            if (!project->isActiveConfig("shallow_bundle")) {
                project->values("TARGET_x.y").append(project->first("QMAKE_BUNDLE") +
                                                          "/Versions/" +
                                                          project->first("QMAKE_FRAMEWORK_VERSION") +
                                                          bundle_loc + project->first("TARGET"));
            } else {
                project->values("TARGET_x.y").append(target);
            }
        } else if(project->isActiveConfig("plugin")) {
            QString prefix;
            if(!project->isActiveConfig("no_plugin_name_prefix"))
                prefix = "lib";
            project->values("PRL_TARGET").prepend(prefix + project->first("TARGET"));
            project->values("TARGET_x.y.z").append(prefix +
                                                        project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN"));
            else
                project->values("TARGET_x").append(prefix + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_PLUGIN") +
                                                        "." + project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else if (!project->isEmpty("QMAKE_HPUX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + ".sl");
            if(project->isActiveConfig("lib_version_first"))
                project->values("TARGET_x").append("lib" + project->first("VER_MAJ") + "." +
                                                        project->first("TARGET"));
            else
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ"));
            project->values("TARGET") = project->values("TARGET_x");
        } else if (!project->isEmpty("QMAKE_AIX_SHLIB")) {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append(project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET")
                    + "." + project->first("QMAKE_EXTENSION_STATICLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB") +
                                                          "." + project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") + "." +
                                                            project->first("VER_PAT"));
            }
            project->values("TARGET") = project->values("TARGET_x.y.z");
        } else {
            project->values("PRL_TARGET").prepend("lib" + project->first("TARGET"));
            project->values("TARGET_").append("lib" + project->first("TARGET") + "." +
                                                   project->first("QMAKE_EXTENSION_SHLIB"));
            if(project->isActiveConfig("lib_version_first")) {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("VER_MAJ") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                          project->first("VER_MAJ") +
                                                          "." + project->first("VER_MIN") + "." +
                                                          project->first("QMAKE_EXTENSION_SHLIB"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT") + "." +
                                                            project->first("QMAKE_EXTENSION_SHLIB"));
            } else {
                project->values("TARGET_x").append("lib" + project->first("TARGET") + "." +
                                                        project->first("QMAKE_EXTENSION_SHLIB") +
                                                        "." + project->first("VER_MAJ"));
                project->values("TARGET_x.y").append("lib" + project->first("TARGET") + "." +
                                                      project->first("QMAKE_EXTENSION_SHLIB")
                                                      + "." + project->first("VER_MAJ") +
                                                      "." + project->first("VER_MIN"));
                project->values("TARGET_x.y.z").append("lib" + project->first("TARGET") +
                                                            "." +
                                                            project->first(
                                                                "QMAKE_EXTENSION_SHLIB") + "." +
                                                            project->first("VER_MAJ") + "." +
                                                            project->first("VER_MIN") +  "." +
                                                            project->first("VER_PAT"));
            }
            if (project->isActiveConfig("unversioned_libname"))
                project->values("TARGET") = project->values("TARGET_");
            else
                project->values("TARGET") = project->values("TARGET_x.y.z");
        }
        if (!project->values("QMAKE_LFLAGS_SONAME").isEmpty()) {
            ProString soname;
            if(project->isActiveConfig("plugin")) {
                if(!project->values("TARGET").isEmpty())
                    soname += project->first("TARGET");
            } else if(!project->isEmpty("QMAKE_BUNDLE")) {
                soname += project->first("TARGET_x.y");
            } else if(project->isActiveConfig("unversioned_soname")) {
                soname = "lib" + project->first("QMAKE_ORIG_TARGET")
                    + "." + project->first("QMAKE_EXTENSION_SHLIB");
            } else if(!project->values("TARGET_x").isEmpty()) {
                soname += project->first("TARGET_x");
            }
            if(!soname.isEmpty()) {
                if(project->isActiveConfig("absolute_library_soname") &&
                   project->values("INSTALLS").indexOf("target") != -1 &&
                   !project->isEmpty("target.path")) {
                    QString instpath = Option::fixPathToTargetOS(project->first("target.path").toQString());
                    if(!instpath.endsWith(Option::dir_sep))
                        instpath += Option::dir_sep;
                    soname.prepend(instpath);
                } else if (!project->isEmpty("QMAKE_SONAME_PREFIX")) {
                    QString sonameprefix = project->first("QMAKE_SONAME_PREFIX").toQString();
                    if (!sonameprefix.startsWith('@'))
                        sonameprefix = Option::fixPathToTargetOS(sonameprefix, false);
                    if (!sonameprefix.endsWith(Option::dir_sep))
                        sonameprefix += Option::dir_sep;
                    soname.prepend(sonameprefix);
                }
                project->values("QMAKE_LFLAGS_SONAME").first() += escapeFilePath(soname);
            }
        }
        if (project->values("QMAKE_LINK_SHLIB_CMD").isEmpty())
            project->values("QMAKE_LINK_SHLIB_CMD").append(
                "$(LINK) $(LFLAGS) " + project->first("QMAKE_LINK_O_FLAG") + "$(TARGET) $(OBJECTS) $(LIBS) $(OBJCOMP)");
    }
    if (!project->values("QMAKE_APP_FLAG").isEmpty() || project->first("TEMPLATE") == "aux") {
        project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_APP");
        project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_APP");
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_APP");
    } else if (project->isActiveConfig("dll")) {
        if(!project->isActiveConfig("plugin") || !project->isActiveConfig("plugin_no_share_shlib_cflags")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_SHLIB");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_SHLIB");
        }
        if (project->isActiveConfig("plugin")) {
            project->values("QMAKE_CFLAGS") += project->values("QMAKE_CFLAGS_PLUGIN");
            project->values("QMAKE_CXXFLAGS") += project->values("QMAKE_CXXFLAGS_PLUGIN");
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PLUGIN");
            if (project->isActiveConfig("plugin_with_soname"))
                project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        } else {
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SHLIB");
            if(!project->isEmpty("QMAKE_LFLAGS_COMPAT_VERSION")) {
                if(project->isEmpty("COMPAT_VERSION"))
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("VER_MAJ") + "." +
                                                                    project->first("VER_MIN"));
                else
                    project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_COMPAT_VERSION") +
                                                                    project->first("COMPATIBILITY_VERSION"));
            }
            if(!project->isEmpty("QMAKE_LFLAGS_VERSION")) {
                project->values("QMAKE_LFLAGS") += QString(project->first("QMAKE_LFLAGS_VERSION") +
                                                                project->first("VER_MAJ") + "." +
                                                                project->first("VER_MIN") + "." +
                                                                project->first("VER_PAT"));
            }
            project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_SONAME");
        }
    }

    if (include_deps && project->isActiveConfig("gcc_MD_depends")) {
        ProString MD_flag("-MD");
        project->values("QMAKE_CFLAGS") += MD_flag;
        project->values("QMAKE_CXXFLAGS") += MD_flag;
    }
}